

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_12uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  OPJ_INT32 OVar3;
  byte *pbVar4;
  OPJ_UINT32 val1_1;
  OPJ_UINT32 val0_1;
  OPJ_UINT32 val2;
  OPJ_UINT32 val1;
  OPJ_UINT32 val0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (_val1 = 0; _val1 < (length & 0xfffffffffffffffe); _val1 = _val1 + 2) {
    OVar3 = *pDst_local;
    pbVar4 = (byte *)((long)pDst_local + 2);
    bVar1 = *(byte *)((long)pDst_local + 1);
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 3);
    bVar2 = *pbVar4;
    pDst[_val1] = (uint)(byte)OVar3 << 4 | (uint)(bVar1 >> 4);
    pDst[_val1 + 1] = (bVar1 & 0xf) << 8 | (uint)bVar2;
  }
  if ((length & 1) != 0) {
    pDst[_val1] = (uint)(byte)*pDst_local << 4 | (uint)(*(byte *)((long)pDst_local + 1) >> 4);
  }
  return;
}

Assistant:

static void tif_12uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)1U); i+=2U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;

		pDst[i+0] = (OPJ_INT32)((val0 << 4) | (val1 >> 4));
		pDst[i+1] = (OPJ_INT32)(((val1 & 0xFU) << 8) | val2);
	}
	if (length & 1U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		pDst[i+0] = (OPJ_INT32)((val0 << 4) | (val1 >> 4));
	}
}